

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerGLSL::to_trivial_mix_op
          (CompilerGLSL *this,SPIRType *type,string *op,uint32_t left,uint32_t right,uint32_t lerp)

{
  uint16_t uVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  float fVar4;
  double dVar5;
  bool local_8e;
  bool local_8d;
  bool local_8c;
  bool local_8b;
  bool local_8a;
  bool local_89;
  undefined1 local_78 [39];
  bool local_51;
  SPIRType *pSStack_50;
  bool ret;
  SPIRType *lerptype;
  SPIRConstant *cright;
  SPIRConstant *cleft;
  uint32_t local_30;
  uint32_t lerp_local;
  uint32_t right_local;
  uint32_t left_local;
  string *op_local;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  
  cleft._4_4_ = lerp;
  local_30 = right;
  lerp_local = left;
  _right_local = op;
  op_local = (string *)type;
  type_local = (SPIRType *)this;
  cright = Compiler::maybe_get<spirv_cross::SPIRConstant>(&this->super_Compiler,left);
  lerptype = (SPIRType *)
             Compiler::maybe_get<spirv_cross::SPIRConstant>(&this->super_Compiler,local_30);
  pSStack_50 = Compiler::expression_type(&this->super_Compiler,cleft._4_4_);
  if ((cright == (SPIRConstant *)0x0) || (lerptype == (SPIRType *)0x0)) {
    this_local._7_1_ = false;
  }
  else if (((cright->specialization & 1U) == 0) &&
          (((lerptype->image).format & ImageFormatRgba32f) == ImageFormatUnknown)) {
    if ((*(int *)&(pSStack_50->super_IVariant).field_0xc == 2) && (pSStack_50->vecsize < 2)) {
      local_51 = false;
      switch(*(undefined4 *)(op_local + 0xc)) {
      case 5:
      case 6:
        uVar1 = SPIRConstant::scalar_u16(cright,0,0);
        local_89 = false;
        if (uVar1 == 0) {
          uVar1 = SPIRConstant::scalar_u16((SPIRConstant *)lerptype,0,0);
          local_89 = uVar1 == 1;
        }
        local_51 = local_89;
        break;
      case 7:
      case 8:
        uVar2 = SPIRConstant::scalar(cright,0,0);
        local_8a = false;
        if (uVar2 == 0) {
          uVar2 = SPIRConstant::scalar((SPIRConstant *)lerptype,0,0);
          local_8a = uVar2 == 1;
        }
        local_51 = local_8a;
        break;
      case 9:
      case 10:
        uVar3 = SPIRConstant::scalar_u64(cright,0,0);
        local_8e = false;
        if (uVar3 == 0) {
          uVar3 = SPIRConstant::scalar_u64((SPIRConstant *)lerptype,0,0);
          local_8e = uVar3 == 1;
        }
        local_51 = local_8e;
        break;
      default:
        break;
      case 0xc:
        fVar4 = SPIRConstant::scalar_f16(cright,0,0);
        local_8b = false;
        if ((fVar4 == 0.0) && (!NAN(fVar4))) {
          fVar4 = SPIRConstant::scalar_f16((SPIRConstant *)lerptype,0,0);
          local_8b = fVar4 == 1.0;
        }
        local_51 = local_8b;
        break;
      case 0xd:
        fVar4 = SPIRConstant::scalar_f32(cright,0,0);
        local_8c = false;
        if ((fVar4 == 0.0) && (!NAN(fVar4))) {
          fVar4 = SPIRConstant::scalar_f32((SPIRConstant *)lerptype,0,0);
          local_8c = fVar4 == 1.0;
        }
        local_51 = local_8c;
        break;
      case 0xe:
        dVar5 = SPIRConstant::scalar_f64(cright,0,0);
        local_8d = false;
        if ((dVar5 == 0.0) && (!NAN(dVar5))) {
          dVar5 = SPIRConstant::scalar_f64((SPIRConstant *)lerptype,0,0);
          local_8d = dVar5 == 1.0;
        }
        local_51 = local_8d;
      }
      if (local_51 != false) {
        type_to_glsl_constructor_abi_cxx11_((CompilerGLSL *)local_78,(SPIRType *)this);
        ::std::__cxx11::string::operator=((string *)_right_local,(string *)local_78);
        ::std::__cxx11::string::~string((string *)local_78);
      }
      this_local._7_1_ = (bool)(local_51 & 1);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CompilerGLSL::to_trivial_mix_op(const SPIRType &type, string &op, uint32_t left, uint32_t right, uint32_t lerp)
{
	auto *cleft = maybe_get<SPIRConstant>(left);
	auto *cright = maybe_get<SPIRConstant>(right);
	auto &lerptype = expression_type(lerp);

	// If our targets aren't constants, we cannot use construction.
	if (!cleft || !cright)
		return false;

	// If our targets are spec constants, we cannot use construction.
	if (cleft->specialization || cright->specialization)
		return false;

	// We can only use trivial construction if we have a scalar
	// (should be possible to do it for vectors as well, but that is overkill for now).
	if (lerptype.basetype != SPIRType::Boolean || lerptype.vecsize > 1)
		return false;

	// If our bool selects between 0 and 1, we can cast from bool instead, making our trivial constructor.
	bool ret = false;
	switch (type.basetype)
	{
	case SPIRType::Short:
	case SPIRType::UShort:
		ret = cleft->scalar_u16() == 0 && cright->scalar_u16() == 1;
		break;

	case SPIRType::Int:
	case SPIRType::UInt:
		ret = cleft->scalar() == 0 && cright->scalar() == 1;
		break;

	case SPIRType::Half:
		ret = cleft->scalar_f16() == 0.0f && cright->scalar_f16() == 1.0f;
		break;

	case SPIRType::Float:
		ret = cleft->scalar_f32() == 0.0f && cright->scalar_f32() == 1.0f;
		break;

	case SPIRType::Double:
		ret = cleft->scalar_f64() == 0.0 && cright->scalar_f64() == 1.0;
		break;

	case SPIRType::Int64:
	case SPIRType::UInt64:
		ret = cleft->scalar_u64() == 0 && cright->scalar_u64() == 1;
		break;

	default:
		break;
	}

	if (ret)
		op = type_to_glsl_constructor(type);
	return ret;
}